

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::forestPackColumns(CLUFactor<double> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  double *pdVar6;
  undefined8 *puVar7;
  long in_RDI;
  int *cbeg;
  int *cmax;
  int *clen;
  int *cidx;
  double *cval;
  Dring *list;
  Dring *ring;
  int colno;
  int j;
  int i;
  int n;
  undefined8 *local_20;
  int local_10;
  int local_c;
  
  pdVar6 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x25bba6);
  lVar1 = *(long *)(in_RDI + 0x180);
  lVar2 = *(long *)(in_RDI + 0x1a8);
  lVar3 = *(long *)(in_RDI + 0x1b0);
  lVar4 = *(long *)(in_RDI + 0x1a0);
  local_c = 0;
  puVar7 = (undefined8 *)(in_RDI + 0x158);
  for (local_20 = (undefined8 *)*puVar7; local_20 != puVar7; local_20 = (undefined8 *)*local_20) {
    iVar5 = *(int *)(local_20 + 2);
    if (*(int *)(lVar4 + (long)iVar5 * 4) != local_c) goto LAB_0025bc3b;
    local_c = *(int *)(lVar2 + (long)iVar5 * 4) + local_c;
    *(undefined4 *)(lVar3 + (long)iVar5 * 4) = *(undefined4 *)(lVar2 + (long)iVar5 * 4);
  }
LAB_0025bd54:
  *(int *)(in_RDI + 0x17c) = local_c;
  *(undefined4 *)(*(long *)(in_RDI + 0x1b0) + (long)*(int *)(in_RDI + 4) * 4) = 0;
  return;
LAB_0025bc3b:
  do {
    iVar5 = *(int *)(local_20 + 2);
    local_10 = *(int *)(lVar4 + (long)iVar5 * 4);
    *(int *)(lVar4 + (long)iVar5 * 4) = local_c;
    *(undefined4 *)(lVar3 + (long)iVar5 * 4) = *(undefined4 *)(lVar2 + (long)iVar5 * 4);
    iVar5 = local_10 + *(int *)(lVar2 + (long)iVar5 * 4);
    for (; local_10 < iVar5; local_10 = local_10 + 1) {
      pdVar6[local_c] = pdVar6[local_10];
      *(undefined4 *)(lVar1 + (long)local_c * 4) = *(undefined4 *)(lVar1 + (long)local_10 * 4);
      local_c = local_c + 1;
    }
    local_20 = (undefined8 *)*local_20;
  } while (local_20 != puVar7);
  goto LAB_0025bd54;
}

Assistant:

void CLUFactor<R>::forestPackColumns()
{
   int n, i, j, colno;
   Dring* ring, *list;

   R* cval = u.col.val.data();
   int* cidx = u.col.idx;
   int* clen = u.col.len;
   int* cmax = u.col.max;
   int* cbeg = u.col.start;

   n = 0;
   list = &u.col.list;

   for(ring = list->next; ring != list; ring = ring->next)
   {
      colno = ring->idx;

      if(cbeg[colno] != n)
      {
         do
         {
            colno = ring->idx;
            i = cbeg[colno];
            cbeg[colno] = n;
            cmax[colno] = clen[colno];
            j = i + clen[colno];

            for(; i < j; ++i)
            {
               cval[n] = cval[i];
               cidx[n++] = cidx[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += clen[colno];

      cmax[colno] = clen[colno];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}